

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsCoreDisconnect(HelicsCore core,HelicsError *err)

{
  Core *pCVar1;
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    (*pCVar1->_vptr_Core[8])(pCVar1);
  }
  return;
}

Assistant:

void helicsCoreDisconnect(HelicsCore core, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }

    try {
        cppcore->disconnect();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}